

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O2

void helper_crypto_sha256h_aarch64(void *vd,void *vn,void *vm)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  undefined8 local_18;
  undefined8 uStack_10;
  
  uVar2 = *vd;
  uVar4 = *(ulong *)((long)vd + 8);
  uVar7 = *vn;
  uVar6 = *(ulong *)((long)vn + 8);
  local_18 = *vm;
  uStack_10 = *(undefined8 *)((long)vm + 8);
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    uVar1 = (uint)uVar7;
    iVar8 = ((uVar1 << 7 | uVar1 >> 0x19) ^
            (uVar1 << 0x15 | uVar1 >> 0xb) ^ (uVar1 << 0x1a | uVar1 >> 6)) + (int)(uVar6 >> 0x20) +
            (((uint)(uVar7 >> 0x20) ^ (uint)uVar6) & uVar1 ^ (uint)uVar6) +
            *(int *)((long)&local_18 + lVar5 * 4);
    uVar6 = uVar6 << 0x20 | uVar7 >> 0x20;
    uVar7 = uVar7 << 0x20 | (ulong)(uint)((int)(uVar4 >> 0x20) + iVar8);
    uVar9 = (uint)(uVar2 >> 0x20);
    uVar1 = (uint)uVar2;
    uVar3 = (uint)uVar4;
    uVar4 = uVar4 << 0x20 | uVar2 >> 0x20;
    uVar2 = uVar2 << 0x20 |
            (ulong)(((uVar1 << 10 | uVar1 >> 0x16) ^
                    (uVar1 << 0x13 | uVar1 >> 0xd) ^ (uVar1 << 0x1e | uVar1 >> 2)) +
                    ((uVar9 | uVar1) & uVar3 | uVar9 & uVar1) + iVar8);
  }
  *(ulong *)vd = uVar2;
  *(ulong *)((long)vd + 8) = uVar4;
  return;
}

Assistant:

void HELPER(crypto_sha256h)(void *vd, void *vn, void *vm)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    uint64_t *rm = vm;
    union CRYPTO_STATE d = { .l = { rd[0], rd[1] } };
    union CRYPTO_STATE n = { .l = { rn[0], rn[1] } };
    union CRYPTO_STATE m = { .l = { rm[0], rm[1] } };
    int i;

    for (i = 0; i < 4; i++) {
        uint32_t t = cho(CR_ST_WORD(n, 0), CR_ST_WORD(n, 1), CR_ST_WORD(n, 2))
                     + CR_ST_WORD(n, 3) + S1(CR_ST_WORD(n, 0))
                     + CR_ST_WORD(m, i);

        CR_ST_WORD(n, 3) = CR_ST_WORD(n, 2);
        CR_ST_WORD(n, 2) = CR_ST_WORD(n, 1);
        CR_ST_WORD(n, 1) = CR_ST_WORD(n, 0);
        CR_ST_WORD(n, 0) = CR_ST_WORD(d, 3) + t;

        t += maj(CR_ST_WORD(d, 0), CR_ST_WORD(d, 1), CR_ST_WORD(d, 2))
             + S0(CR_ST_WORD(d, 0));

        CR_ST_WORD(d, 3) = CR_ST_WORD(d, 2);
        CR_ST_WORD(d, 2) = CR_ST_WORD(d, 1);
        CR_ST_WORD(d, 1) = CR_ST_WORD(d, 0);
        CR_ST_WORD(d, 0) = t;
    }

    rd[0] = d.l[0];
    rd[1] = d.l[1];
}